

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int Curl_removeHandleFromPipeline(SessionHandle *handle,curl_llist *pipeline)

{
  curl_llist_element *e;
  curl_llist *pcVar1;
  
  pcVar1 = pipeline;
  while( true ) {
    e = pcVar1->head;
    if (e == (curl_llist_element *)0x0) {
      return 0;
    }
    if ((SessionHandle *)e->ptr == handle) break;
    pcVar1 = (curl_llist *)&e->next;
  }
  Curl_llist_remove(pipeline,e,(void *)0x0);
  return 1;
}

Assistant:

int Curl_removeHandleFromPipeline(struct SessionHandle *handle,
                                  struct curl_llist *pipeline)
{
  struct curl_llist_element *curr;

  curr = pipeline->head;
  while(curr) {
    if(curr->ptr == handle) {
      Curl_llist_remove(pipeline, curr, NULL);
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }

  return 0;
}